

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::api::HDWalletApi::CreateExtkeyFromPathString
          (HDWalletApi *this,string *extkey,NetType net_type,ExtKeyType output_key_type,string *path
          )

{
  bool bVar1;
  string *message;
  ulong uVar2;
  undefined8 uVar3;
  NetType in_ECX;
  string *in_RDX;
  string *in_RDI;
  int in_R8D;
  string *in_R9;
  string errmsg_1;
  CfdException *pub_except;
  ExtPubkey pubkey;
  string errmsg;
  CfdException *except;
  ExtPrivkey privkey;
  uint32_t version;
  uint32_t check_version;
  string *result;
  ExtPrivkey *in_stack_fffffffffffffa50;
  allocator *paVar4;
  string *in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa70;
  allocator local_529;
  string local_528 [32];
  CfdSourceLocation local_508;
  ExtPubkey local_4f0;
  string local_480;
  string local_460;
  undefined1 local_43a;
  allocator local_439;
  string local_438 [32];
  CfdSourceLocation local_418 [5];
  ExtPubkey local_390;
  ExtPubkey local_320;
  ExtPubkey local_2b0;
  string local_240;
  ExtPrivkey local_220;
  string local_1a8;
  string local_188 [2];
  ExtPrivkey local_138;
  ExtPrivkey local_b0;
  uint32_t local_34;
  uint32_t local_30;
  byte local_29;
  string *local_28;
  int local_20;
  NetType local_1c;
  string *local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  local_29 = 0;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  core::ExtPrivkey::ExtPrivkey(&local_b0);
  core::ExtPrivkey::ExtPrivkey(&local_138,local_18);
  core::ExtPrivkey::operator=(&local_b0,&local_138);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffa50);
  bVar1 = core::ExtPrivkey::IsValid(&local_b0);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      if (local_20 == 0) {
        core::ExtPrivkey::DerivePrivkey(&local_220,&local_b0,local_28);
        core::ExtPrivkey::ToString_abi_cxx11_(&local_1a8,&local_220);
        std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffa50);
      }
      else {
        core::ExtPrivkey::DerivePubkey(&local_2b0,&local_b0,local_28);
        core::ExtPubkey::ToString_abi_cxx11_(&local_240,&local_2b0);
        std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa50);
      }
    }
    else {
      core::ExtPrivkey::ToString_abi_cxx11_(local_188,&local_b0);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
    local_34 = core::ExtPrivkey::GetVersion(&local_b0);
    local_30 = GetExtkeyVersion(kExtPrivkey,local_1c);
  }
  else {
    core::ExtPubkey::ExtPubkey(&local_320);
    core::ExtPubkey::ExtPubkey(&local_390,local_18);
    core::ExtPubkey::operator=(&local_320,&local_390);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa50);
    if (local_20 == 0) {
      local_418[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                   ,0x2f);
      local_418[0].filename = local_418[0].filename + 1;
      local_418[0].line = 0x108;
      local_418[0].funcname = "CreateExtkeyFromPathString";
      core::logger::warn<>(local_418,"Illegal output_key_type. Cannot create privkey from pubkey.");
      local_43a = 1;
      message = (string *)__cxa_allocate_exception(0x30);
      paVar4 = &local_439;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_438,"Illegal output_key_type. Cannot create privkey from pubkey.",paVar4);
      core::CfdException::CfdException
                (in_stack_fffffffffffffa70,(CfdError)((ulong)paVar4 >> 0x20),message);
      local_43a = 0;
      __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      core::ExtPubkey::DerivePubkey(&local_4f0,&local_320,local_28);
      core::ExtPubkey::ToString_abi_cxx11_(&local_480,&local_4f0);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa50);
    }
    else {
      core::ExtPubkey::ToString_abi_cxx11_(&local_460,&local_320);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_460);
      std::__cxx11::string::~string((string *)&local_460);
    }
    local_34 = core::ExtPubkey::GetVersion(&local_320);
    local_30 = GetExtkeyVersion(kExtPubkey,local_1c);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa50);
  }
  if (local_34 == local_30) {
    local_29 = 1;
    core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffa50);
    if ((local_29 & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
    return in_RDI;
  }
  local_508.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
               ,0x2f);
  local_508.filename = local_508.filename + 1;
  local_508.line = 0x118;
  local_508.funcname = "CreateExtkeyFromPathString";
  core::logger::warn<unsigned_int&>(&local_508,"Version unmatch. key version: {}",&local_34);
  uVar3 = __cxa_allocate_exception(0x30);
  paVar4 = &local_529;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"extkey networkType unmatch.",paVar4);
  core::CfdException::CfdException(in_stack_fffffffffffffa70,error_code,in_stack_fffffffffffffa60);
  __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::CreateExtkeyFromPathString(
    const std::string& extkey, NetType net_type, ExtKeyType output_key_type,
    const std::string& path) const {
  std::string result;
  uint32_t check_version;
  uint32_t version;

  // TODO(k-matsuzawa): child_number_listの方とロジック同じなので統合したい
  ExtPrivkey privkey;
  try {
    privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (privkey.IsValid()) {
    if (path.empty()) {
      result = privkey.ToString();
    } else if (output_key_type == ExtKeyType::kExtPrivkey) {
      result = privkey.DerivePrivkey(path).ToString();
    } else {
      result = privkey.DerivePubkey(path).ToString();
    }
    version = privkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);

  } else {
    ExtPubkey pubkey;
    try {
      pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }

    if (output_key_type == ExtKeyType::kExtPrivkey) {
      warn(
          CFD_LOG_SOURCE,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
    }
    if (path.empty()) {
      result = pubkey.ToString();
    } else {
      result = pubkey.DerivePubkey(path).ToString();
    }
    version = pubkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  }

  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return result;
}